

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRangeDescriptions.hpp
# Opt level: O2

tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_> *
__thiscall
njoy::ENDFtk::record::InterpolationBase::
readRangeDescriptions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
           *__return_storage_ptr__,InterpolationBase *this,long nRanges,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  int in_stack_ffffffffffffffb8;
  
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
           ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
           super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
  super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
           ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
           super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  Zipper::
  unzip<njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
              *)&stack0xffffffffffffffb8,(Zipper *)this,nRanges,it,end,lineNumber,MAT,MF,
             in_stack_ffffffffffffffb8);
  std::tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>::
  operator=(__return_storage_ptr__,(type)&stack0xffffffffffffffb8);
  std::
  _Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
                  *)&stack0xffffffffffffffb8);
  verifyBoundaryIndicesAreSorted
            (&(__return_storage_ptr__->
              super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
              ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl)
  ;
  return __return_storage_ptr__;
}

Assistant:

static std::tuple< std::vector< long >, std::vector< long > >
readRangeDescriptions
( long nRanges, Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT ){
  try{
    std::tuple< std::vector< long >, std::vector< long > > result;
    result = record::Zipper::unzip< record::Integer<11>, record::Integer<11> >
             ( nRanges, it, end, lineNumber, MAT, MF, MT );
    auto& boundaryIndices = std::get< 0 >( result );
    verifyBoundaryIndicesAreSorted( boundaryIndices );
    return result;
  } catch( std::exception& e ){
    Log::info( "Error encountered reading range descriptions" );
    throw e;
  }
}